

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CEPlanet * CEPlanet::EMBarycenter(void)

{
  CEPlanet *in_RDI;
  CEPlanet *em_barycenter;
  CEPlanet *angle;
  CEPlanet *this;
  uint in_stack_ffffffffffffff80;
  CEAngle *ycoord;
  CEAngle *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  CEPlanet *this_00;
  undefined1 local_31 [40];
  undefined1 local_9;
  
  local_9 = CIRS;
  this = (CEPlanet *)local_31;
  angle = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"EMBaryCenter",(allocator *)this);
  this_00 = (CEPlanet *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  ycoord = (CEAngle *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  CEPlanet(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,ycoord,
           (CESkyCoordType *)(ulong)in_stack_ffffffffffffff80);
  CEAngle::~CEAngle((CEAngle *)0x13fab1);
  CEAngle::~CEAngle((CEAngle *)0x13fabb);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  SetSemiMajorAxis_AU(this,(double)angle,(double)in_RDI);
  SetEccentricity(in_RDI,0.01673163,-3.661e-05);
  SetInclination(in_RDI,-0.00054346,-0.01337178,DEGREES);
  SetMeanLongitude(in_RDI,100.46691572,35999.37306329,DEGREES);
  SetPerihelionLongitude(in_RDI,102.93005885,0.3179526,DEGREES);
  SetAscendingNodeLongitude(in_RDI,-5.11260389,-0.24123856,DEGREES);
  SetSofaID(this,(double *)angle);
  return angle;
}

Assistant:

CEPlanet CEPlanet::EMBarycenter()
{
    CEPlanet em_barycenter("EMBaryCenter", 0.0, 0.0) ;
    em_barycenter.SetSemiMajorAxis_AU(1.00000018, -0.00000003) ;
    em_barycenter.SetEccentricity(0.01673163, -0.00003661) ;
    em_barycenter.SetInclination(-0.00054346, -0.01337178, CEAngleType::DEGREES) ;
    em_barycenter.SetMeanLongitude(100.46691572, 35999.37306329, CEAngleType::DEGREES) ;
    em_barycenter.SetPerihelionLongitude(102.93005885, 0.31795260, CEAngleType::DEGREES) ;
    em_barycenter.SetAscendingNodeLongitude(-5.11260389, -0.24123856, CEAngleType::DEGREES) ;

    // Set the sofa planet ID
    em_barycenter.SetSofaID(3) ;
    
    return em_barycenter ;
}